

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFArgParser.cc
# Opt level: O0

void __thiscall
QPDFArgParser::QPDFArgParser(QPDFArgParser *this,int argc,char **argv,char *progname_env)

{
  Members *this_00;
  bare_arg_handler_t local_198;
  allocator<char> local_171;
  string local_170;
  code *local_150;
  undefined8 local_148;
  bare_arg_handler_t local_140;
  allocator<char> local_119;
  string local_118;
  code *local_f8;
  undefined8 local_f0;
  param_arg_handler_t local_e8;
  allocator<char> local_c1;
  string local_c0;
  code *local_a0;
  undefined8 local_98;
  param_arg_handler_t local_90;
  allocator<char> local_69;
  string local_68;
  char *pcStack_48;
  char *help_choices [2];
  char *progname_env_local;
  char **argv_local;
  int argc_local;
  QPDFArgParser *this_local;
  
  this_00 = (Members *)operator_new(0x290);
  Members::Members(this_00,argc,argv,progname_env);
  std::shared_ptr<QPDFArgParser::Members>::shared_ptr<QPDFArgParser::Members,void>(&this->m,this_00)
  ;
  selectHelpOptionTable(this);
  pcStack_48 = "all";
  help_choices[0] = (char *)0x0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"help",&local_69);
  local_a0 = argHelp;
  local_98 = 0;
  bindParam<QPDFArgParser>(&local_90,(QPDFArgParser *)argHelp,0,this);
  addChoices(this,&local_68,&local_90,false,&pcStack_48);
  std::
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function(&local_90);
  std::__cxx11::string::~string((string *)&local_68);
  std::allocator<char>::~allocator(&local_69);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_c0,"help",&local_c1);
  local_f8 = invalidHelpArg;
  local_f0 = 0;
  bindParam<QPDFArgParser>(&local_e8,(QPDFArgParser *)invalidHelpArg,0,this);
  addInvalidChoiceHandler(this,&local_c0,&local_e8);
  std::
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function(&local_e8);
  std::__cxx11::string::~string((string *)&local_c0);
  std::allocator<char>::~allocator(&local_c1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_118,"completion-bash",&local_119);
  local_150 = argCompletionBash;
  local_148 = 0;
  bindBare<QPDFArgParser>(&local_140,(QPDFArgParser *)argCompletionBash,0,this);
  addBare(this,&local_118,&local_140);
  std::function<void_()>::~function(&local_140);
  std::__cxx11::string::~string((string *)&local_118);
  std::allocator<char>::~allocator(&local_119);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_170,"completion-zsh",&local_171);
  bindBare<QPDFArgParser>(&local_198,(QPDFArgParser *)argCompletionZsh,0,this);
  addBare(this,&local_170,&local_198);
  std::function<void_()>::~function(&local_198);
  std::__cxx11::string::~string((string *)&local_170);
  std::allocator<char>::~allocator(&local_171);
  selectMainOptionTable(this);
  return;
}

Assistant:

QPDFArgParser::QPDFArgParser(int argc, char const* const argv[], char const* progname_env) :
    m(new Members(argc, argv, progname_env))
{
    selectHelpOptionTable();
    char const* help_choices[] = {"all", nullptr};
    // More help choices are added dynamically.
    addChoices("help", bindParam(&QPDFArgParser::argHelp, this), false, help_choices);
    addInvalidChoiceHandler("help", bindParam(&QPDFArgParser::invalidHelpArg, this));
    addBare("completion-bash", bindBare(&QPDFArgParser::argCompletionBash, this));
    addBare("completion-zsh", bindBare(&QPDFArgParser::argCompletionZsh, this));
    selectMainOptionTable();
}